

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
::select_variables(solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                   *this,int r_size,int bkmin,int bkmax)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  
  iVar2 = bkmin;
  if (r_size < bkmin) {
    iVar2 = r_size;
  }
  iVar3 = iVar2;
  if (bkmin != bkmax) {
    iVar3 = bkmax;
    if (r_size < bkmax) {
      iVar3 = r_size;
    }
    if (iVar2 <= bkmax) {
      if (bkmin < r_size) {
        r_size = bkmin;
      }
      lVar4 = (long)r_size;
      if (iVar2 < iVar3) {
        iVar2 = iVar3;
      }
      iVar2 = (iVar2 - r_size) + 1;
      do {
        fVar1 = (this->R)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
                ._M_head_impl[lVar4].value;
        bVar6 = fVar1 == 0.0;
        bVar5 = fVar1 < 0.0;
        if ((bVar6) && (!NAN(fVar1))) {
          dVar7 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          bVar6 = dVar7 == 0.5;
          bVar5 = 0.5 < dVar7;
        }
        if (!bVar5 && !bVar6) {
          iVar3 = (int)lVar4;
          break;
        }
        lVar4 = lVar4 + 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  return iVar3 + -1;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }